

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O1

void __thiscall pybind11::array::resize(array *this,ShapeContainer *new_shape,bool refcheck)

{
  bool bVar1;
  npy_api *pnVar2;
  error_already_set *this_00;
  undefined7 in_register_00000011;
  object new_array;
  PyArray_Dims d;
  object local_38;
  array local_30;
  PyArray_Dims local_28;
  
  local_28.ptr = (new_shape->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_28.len = (int)((ulong)((long)(new_shape->v).super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)local_28.ptr)
                      >> 3);
  pnVar2 = detail::npy_api::get();
  local_38.super_handle.m_ptr =
       (handle)(*pnVar2->PyArray_Resize_)
                         ((this->super_buffer).super_object.super_handle.m_ptr,&local_28,
                          (int)CONCAT71(in_register_00000011,refcheck),-1);
  if (local_38.super_handle.m_ptr != (PyObject *)0x0) {
    bVar1 = check_(local_38.super_handle);
    if (bVar1) {
      array(&local_30,&local_38);
      object::operator=((object *)this,(object *)&local_30);
      object::~object((object *)&local_30);
    }
    object::~object(&local_38);
    return;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

void resize(ShapeContainer new_shape, bool refcheck = true) {
        detail::npy_api::PyArray_Dims d = {
            new_shape->data(), int(new_shape->size())
        };
        // try to resize, set ordering param to -1 cause it's not used anyway
        object new_array = reinterpret_steal<object>(
            detail::npy_api::get().PyArray_Resize_(m_ptr, &d, int(refcheck), -1)
        );
        if (!new_array) throw error_already_set();
        if (isinstance<array>(new_array)) { *this = std::move(new_array); }
    }